

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexerHelper.cxx
# Opt level: O0

void __thiscall cmGccDepfileLexerHelper::newEntry(cmGccDepfileLexerHelper *this)

{
  bool bVar1;
  reference pvVar2;
  ulong uVar3;
  cmGccDepfileLexerHelper *this_local;
  
  if ((this->HelperState != Rule) ||
     (bVar1 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::empty
                        (&this->Content), bVar1)) {
    this->HelperState = Rule;
    std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::emplace_back<>
              (&this->Content);
    newRule(this);
  }
  else {
    pvVar2 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::back
                       (&this->Content);
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&pvVar2->rules);
    if (!bVar1) {
      pvVar2 = std::vector<cmGccStyleDependency,_std::allocator<cmGccStyleDependency>_>::back
                         (&this->Content);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::back(&pvVar2->rules);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        this->HelperState = Failed;
      }
    }
  }
  return;
}

Assistant:

void cmGccDepfileLexerHelper::newEntry()
{
  if (this->HelperState == State::Rule && !this->Content.empty()) {
    if (!this->Content.back().rules.empty() &&
        !this->Content.back().rules.back().empty()) {
      this->HelperState = State::Failed;
    }
    return;
  }
  this->HelperState = State::Rule;
  this->Content.emplace_back();
  this->newRule();
}